

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O3

Expression *
soul::ExpressionHelpers::fromIdentifier(Expression *__return_storage_ptr__,QualifiedIdentifier *q)

{
  pointer pPVar1;
  int iVar2;
  undefined4 extraout_var;
  Scope *pSVar3;
  IdentifierPath *partialName;
  Scope *p;
  string text;
  string resolvedUID;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  Identifier *local_78;
  size_t local_70;
  Ptr local_68;
  undefined4 extraout_var_00;
  
  IdentifierPath::toString_abi_cxx11_
            (&local_138,
             &((q->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_start)->path);
  iVar2 = std::__cxx11::string::compare((char *)&local_138);
  if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)&local_138), iVar2 == 0)) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_138._M_dataplus._M_p,
               local_138._M_dataplus._M_p + local_138._M_string_length);
    createPrimitive(__return_storage_ptr__,&local_98);
    local_118._M_dataplus._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_0023f37e;
  }
  else {
    pPVar1 = (q->pathSections).
             super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((long)(q->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 == 0x60) &&
       ((pPVar1->specialisationArgs).object == (Expression *)0x0)) {
      pSVar3 = (q->super_Expression).super_Statement.super_ASTObject.context.parentScope;
      partialName = (IdentifierPath *)0x60;
      do {
        iVar2 = (*pSVar3->_vptr_Scope[5])(pSVar3);
        if ((ExpressionHelpers *)CONCAT44(extraout_var,iVar2) != (ExpressionHelpers *)0x0) {
          IdentifierPath::operator+
                    ((IdentifierPath *)&stack0xffffffffffffff88,&q->pathPrefix,
                     &((q->pathSections).
                       super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                       ._M_impl.super__Vector_impl_data._M_start)->path);
          resolvePartialNameAsUID_abi_cxx11_
                    (&local_118,(ExpressionHelpers *)CONCAT44(extraout_var,iVar2),
                     (ModuleBase *)&stack0xffffffffffffff88,partialName);
          local_70 = 0;
          if (((SourceCodeText *)0x8 < local_68.object) && (local_78 != (Identifier *)0x0)) {
            operator_delete__(local_78);
          }
          if (local_118._M_string_length != 0) {
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b8,local_138._M_dataplus._M_p,
                       local_138._M_dataplus._M_p + local_138._M_string_length);
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d8,local_118._M_dataplus._M_p,
                       local_118._M_dataplus._M_p + local_118._M_string_length);
            createStruct(__return_storage_ptr__,&local_b8,&local_d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            local_98.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) goto LAB_0023f376;
            goto LAB_0023f37e;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          break;
        }
        iVar2 = (*pSVar3->_vptr_Scope[4])(pSVar3);
        pSVar3 = (Scope *)CONCAT44(extraout_var_00,iVar2);
      } while (pSVar3 != (Scope *)0x0);
    }
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_138._M_dataplus._M_p,
               local_138._M_dataplus._M_p + local_138._M_string_length);
    createText(__return_storage_ptr__,&local_f8);
    local_98.field_2._M_allocated_capacity = local_f8.field_2._M_allocated_capacity;
    local_118._M_dataplus._M_p = local_f8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) goto LAB_0023f37e;
  }
LAB_0023f376:
  operator_delete(local_118._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
LAB_0023f37e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression fromIdentifier (AST::QualifiedIdentifier& q)
    {
        auto text = q.toString();

        if (text == "wrap" || text == "clamp")
            return createPrimitive (text);

        if (q.isSimplePath())
        {
            if (auto parentModule = q.getParentScope()->findModule())
            {
                auto resolvedUID = resolvePartialNameAsUID (*parentModule, q.getPath());

                if (! resolvedUID.empty())
                    return createStruct (text, resolvedUID);
            }
        }

        return createText (text);
    }